

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

void vk::validateAllocationCallbacks
               (AllocationCallbackRecorder *recorder,AllocationCallbackValidationResults *results)

{
  VkSystemAllocationScope *pVVar1;
  bool bVar2;
  deBool dVar3;
  size_t a;
  undefined8 uVar4;
  size_type sVar5;
  mapped_type_conflict1 *pmVar6;
  reference pvVar7;
  pointer pAVar8;
  VkSystemAllocationScope *local_3d8;
  VkSystemAllocationScope *local_3d0;
  VkSystemAllocationScope *local_3c8;
  VkSystemAllocationScope *local_3c0;
  __normal_iterator<vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
  local_3a8;
  __normal_iterator<vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
  local_3a0;
  __normal_iterator<const_vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
  local_398;
  const_iterator slotIter;
  AllocationCallbackViolation local_358;
  undefined8 local_320;
  size_t size;
  size_t *totalAllocSizePtr;
  AllocationCallbackViolation local_2d8;
  size_type local_2a0;
  size_t slotNdx_3;
  size_t slotNdx_2;
  AllocationCallbackViolation local_258;
  size_type local_220;
  size_t slotNdx_1;
  AllocationCallbackViolation local_1e0;
  AllocationCallbackViolation local_1a8;
  reference local_170;
  AllocationSlot *origSlot;
  size_t origSlotNdx;
  size_t slotNdx;
  AllocationCallbackViolation local_120;
  AllocationCallbackViolation local_e8;
  VkSystemAllocationScope *local_b0;
  VkSystemAllocationScope *scopePtr;
  AllocationCallbackRecord *record;
  undefined1 local_78 [8];
  RecordIterator callbackIter;
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ptrToSlotIndex;
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  allocations;
  AllocationCallbackValidationResults *results_local;
  AllocationCallbackRecorder *recorder_local;
  
  std::
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ::vector((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::map((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
         *)&callbackIter.m_slotNdx);
  AllocationCallbackRecorder::getRecordsBegin((RecordIterator *)local_78,recorder);
  while( true ) {
    AllocationCallbackRecorder::getRecordsEnd((RecordIterator *)&record,recorder);
    bVar2 = de::AppendList<vk::AllocationCallbackRecord>::
            Iterator<const_vk::AllocationCallbackRecord>::operator!=
                      ((Iterator<const_vk::AllocationCallbackRecord> *)local_78,
                       (Iterator<const_vk::AllocationCallbackRecord> *)&record);
    if (!bVar2) break;
    scopePtr = &de::AppendList<vk::AllocationCallbackRecord>::
                Iterator<const_vk::AllocationCallbackRecord>::operator*
                          ((Iterator<const_vk::AllocationCallbackRecord> *)local_78)->type;
    if (((AllocationCallbackRecord *)scopePtr)->type == TYPE_ALLOCATION) {
      local_3c0 = &(((AllocationCallbackRecord *)scopePtr)->data).allocation.scope;
    }
    else {
      if (((AllocationCallbackRecord *)scopePtr)->type == TYPE_REALLOCATION) {
        local_3c8 = &(((AllocationCallbackRecord *)scopePtr)->data).reallocation.scope;
      }
      else {
        if (((AllocationCallbackRecord *)scopePtr)->type == TYPE_INTERNAL_ALLOCATION) {
          local_3d0 = (VkSystemAllocationScope *)
                      ((long)&((AllocationCallbackRecord *)scopePtr)->data + 0xc);
        }
        else {
          if (((AllocationCallbackRecord *)scopePtr)->type == TYPE_INTERNAL_FREE) {
            local_3d8 = (VkSystemAllocationScope *)
                        ((long)&((AllocationCallbackRecord *)scopePtr)->data + 0xc);
          }
          else {
            local_3d8 = (VkSystemAllocationScope *)0x0;
          }
          local_3d0 = local_3d8;
        }
        local_3c8 = local_3d0;
      }
      local_3c0 = local_3c8;
    }
    local_b0 = local_3c0;
    if ((local_3c0 != (VkSystemAllocationScope *)0x0) &&
       (bVar2 = de::inBounds<vk::VkSystemAllocationScope>
                          (*local_3c0,VK_SYSTEM_ALLOCATION_SCOPE_COMMAND,
                           VK_SYSTEM_ALLOCATION_SCOPE_LAST), !bVar2)) {
      AllocationCallbackViolation::AllocationCallbackViolation
                (&local_e8,(AllocationCallbackRecord *)scopePtr,REASON_INVALID_ALLOCATION_SCOPE);
      std::vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ::push_back(&results->violations,&local_e8);
    }
    if ((*scopePtr == VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) ||
       (*scopePtr == VK_SYSTEM_ALLOCATION_SCOPE_OBJECT)) {
      a = anon_unknown_13::getAlignment((AllocationCallbackRecord *)scopePtr);
      dVar3 = deIsPowerOfTwoSize(a);
      if (dVar3 == 0) {
        AllocationCallbackViolation::AllocationCallbackViolation
                  (&local_120,(AllocationCallbackRecord *)scopePtr,REASON_INVALID_ALIGNMENT);
        std::
        vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>::
        push_back(&results->violations,&local_120);
      }
    }
    switch(*scopePtr) {
    case VK_SYSTEM_ALLOCATION_SCOPE_COMMAND:
      if (*(undefined8 *)(scopePtr + 8) != VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
        bVar2 = de::
                contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                          ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                            *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 8));
        if (bVar2) {
          pmVar6 = std::
                   map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                   ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                 *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 8));
          origSlotNdx = *pmVar6;
          pvVar7 = std::
                   vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                   ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                 *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                origSlotNdx);
          if ((pvVar7->isLive & 1U) == 0) {
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,origSlotNdx);
            pVVar1 = scopePtr;
            pvVar7->isLive = true;
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,origSlotNdx);
            memcpy(pvVar7,pVVar1,0x30);
          }
        }
        else {
          sVar5 = std::
                  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                  ::size((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                          *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pmVar6 = std::
                   map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                   ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                 *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 8));
          *pmVar6 = sVar5;
          anon_unknown_13::AllocationSlot::AllocationSlot
                    ((AllocationSlot *)&slotNdx,(AllocationCallbackRecord *)scopePtr,true);
          std::
          vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
          ::push_back((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                       *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (value_type *)&slotNdx);
        }
      }
      break;
    case VK_SYSTEM_ALLOCATION_SCOPE_OBJECT:
      bVar2 = de::
              contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                        ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                          *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 2));
      if (bVar2) {
        pmVar6 = std::
                 map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                 ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                               *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 2));
        origSlot = (AllocationSlot *)*pmVar6;
        local_170 = std::
                    vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                  *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 ,(size_type)origSlot);
        if (*(undefined8 *)(scopePtr + 4) == VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
          local_170->isLive = false;
        }
        else {
          uVar4 = anon_unknown_13::getAlignment(&local_170->record);
          if (uVar4 != *(undefined8 *)(scopePtr + 6)) {
            AllocationCallbackViolation::AllocationCallbackViolation
                      (&local_1a8,(AllocationCallbackRecord *)scopePtr,
                       REASON_REALLOC_DIFFERENT_ALIGNMENT);
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::push_back(&results->violations,&local_1a8);
          }
          if (*(undefined8 *)(scopePtr + 2) == *(undefined8 *)(scopePtr + 10)) {
            if ((local_170->isLive & 1U) == 0) {
              AllocationCallbackViolation::AllocationCallbackViolation
                        (&local_1e0,(AllocationCallbackRecord *)scopePtr,REASON_REALLOC_FREED_PTR);
              std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::push_back(&results->violations,&local_1e0);
              local_170->isLive = true;
            }
            pVVar1 = scopePtr;
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,(size_type)origSlot);
            memcpy(pvVar7,pVVar1,0x30);
          }
          else if (*(undefined8 *)(scopePtr + 10) != VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,(size_type)origSlot);
            pvVar7->isLive = false;
            bVar2 = de::
                    contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                              ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
            if (bVar2) {
              pmVar6 = std::
                       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                       ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                     *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
              local_220 = *pmVar6;
              pvVar7 = std::
                       vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                       ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                     *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,local_220);
              if ((pvVar7->isLive & 1U) == 0) {
                pvVar7 = std::
                         vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                         ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                       *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,local_220);
                pVVar1 = scopePtr;
                pvVar7->isLive = true;
                pvVar7 = std::
                         vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                         ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                       *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,local_220);
                memcpy(pvVar7,pVVar1,0x30);
              }
            }
            else {
              sVar5 = std::
                      vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                      ::size((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                              *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
              pmVar6 = std::
                       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                       ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                     *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
              *pmVar6 = sVar5;
              anon_unknown_13::AllocationSlot::AllocationSlot
                        ((AllocationSlot *)&slotNdx_1,(AllocationCallbackRecord *)scopePtr,true);
              std::
              vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
              ::push_back((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                           *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (value_type *)&slotNdx_1);
            }
          }
        }
      }
      else {
        if (*(undefined8 *)(scopePtr + 2) != VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
          AllocationCallbackViolation::AllocationCallbackViolation
                    (&local_258,(AllocationCallbackRecord *)scopePtr,
                     REASON_REALLOC_NOT_ALLOCATED_PTR);
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::push_back(&results->violations,&local_258);
        }
        if (*(undefined8 *)(scopePtr + 10) != VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
          bVar2 = de::
                  contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                            ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                              *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
          if (bVar2) {
            pmVar6 = std::
                     map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                     ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                   *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
            slotNdx_3 = *pmVar6;
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,slotNdx_3);
            pVVar1 = scopePtr;
            pvVar7->isLive = true;
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,slotNdx_3);
            memcpy(pvVar7,pVVar1,0x30);
          }
          else {
            sVar5 = std::
                    vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                    ::size((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                            *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
            pmVar6 = std::
                     map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                     ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                   *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 10));
            *pmVar6 = sVar5;
            anon_unknown_13::AllocationSlot::AllocationSlot
                      ((AllocationSlot *)&slotNdx_2,(AllocationCallbackRecord *)scopePtr,true);
            std::
            vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
            ::push_back((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                         *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (value_type *)&slotNdx_2);
          }
        }
      }
      break;
    case VK_SYSTEM_ALLOCATION_SCOPE_CACHE:
      if (*(undefined8 *)(scopePtr + 2) != VK_SYSTEM_ALLOCATION_SCOPE_COMMAND) {
        bVar2 = de::
                contains<std::map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>>
                          ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                            *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 2));
        if (bVar2) {
          pmVar6 = std::
                   map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                   ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                 *)&callbackIter.m_slotNdx,(key_type *)(scopePtr + 2));
          local_2a0 = *pmVar6;
          pvVar7 = std::
                   vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                   ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                 *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_2a0);
          if ((pvVar7->isLive & 1U) == 0) {
            AllocationCallbackViolation::AllocationCallbackViolation
                      (&local_2d8,(AllocationCallbackRecord *)scopePtr,REASON_DOUBLE_FREE);
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::push_back(&results->violations,&local_2d8);
          }
          else {
            pvVar7 = std::
                     vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                     ::operator[]((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                                   *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,local_2a0);
            pvVar7->isLive = false;
          }
        }
        else {
          AllocationCallbackViolation::AllocationCallbackViolation
                    ((AllocationCallbackViolation *)&totalAllocSizePtr,
                     (AllocationCallbackRecord *)scopePtr,REASON_FREE_NOT_ALLOCATED_PTR);
          std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::push_back(&results->violations,(value_type *)&totalAllocSizePtr);
        }
      }
      break;
    case VK_SYSTEM_ALLOCATION_SCOPE_DEVICE:
    case VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE:
      bVar2 = de::inBounds<vk::VkInternalAllocationType>
                        (scopePtr[4],VK_INTERNAL_ALLOCATION_TYPE_EXECUTABLE,
                         VK_INTERNAL_ALLOCATION_TYPE_LAST);
      if (bVar2) {
        size = (size_t)(results->internalAllocationTotal[scopePtr[4]] + scopePtr[5]);
        local_320 = *(undefined8 *)(scopePtr + 2);
        if (*scopePtr == VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE) {
          if ((ulong)*(undefined8 *)size < (ulong)local_320) {
            AllocationCallbackViolation::AllocationCallbackViolation
                      (&local_358,(AllocationCallbackRecord *)scopePtr,
                       REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL);
            std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::push_back(&results->violations,&local_358);
            *(undefined8 *)size = 0;
          }
          else {
            *(ulong *)size = *(ulong *)size - local_320;
          }
        }
        else {
          *(ulong *)size = local_320 + *(ulong *)size;
        }
      }
      else {
        AllocationCallbackViolation::AllocationCallbackViolation
                  ((AllocationCallbackViolation *)&slotIter,(AllocationCallbackRecord *)scopePtr,
                   REASON_INVALID_INTERNAL_ALLOCATION_TYPE);
        std::
        vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>::
        push_back(&results->violations,(value_type *)&slotIter);
      }
    }
    de::AppendList<vk::AllocationCallbackRecord>::Iterator<const_vk::AllocationCallbackRecord>::
    operator++((Iterator<const_vk::AllocationCallbackRecord> *)local_78);
  }
  local_3a0._M_current =
       (AllocationSlot *)
       std::
       vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
       ::begin((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __gnu_cxx::
  __normal_iterator<vk::(anonymous_namespace)::AllocationSlot_const*,std::vector<vk::(anonymous_namespace)::AllocationSlot,std::allocator<vk::(anonymous_namespace)::AllocationSlot>>>
  ::__normal_iterator<vk::(anonymous_namespace)::AllocationSlot*>
            ((__normal_iterator<vk::(anonymous_namespace)::AllocationSlot_const*,std::vector<vk::(anonymous_namespace)::AllocationSlot,std::allocator<vk::(anonymous_namespace)::AllocationSlot>>>
              *)&local_398,&local_3a0);
  while( true ) {
    local_3a8._M_current =
         (AllocationSlot *)
         std::
         vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
         ::end((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
                *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = __gnu_cxx::operator!=(&local_398,&local_3a8);
    if (!bVar2) break;
    pAVar8 = __gnu_cxx::
             __normal_iterator<const_vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
             ::operator->(&local_398);
    if ((pAVar8->isLive & 1U) != 0) {
      pAVar8 = __gnu_cxx::
               __normal_iterator<const_vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
               ::operator->(&local_398);
      std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>::
      push_back(&results->liveAllocations,&pAVar8->record);
    }
    __gnu_cxx::
    __normal_iterator<const_vk::(anonymous_namespace)::AllocationSlot_*,_std::vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>_>
    ::operator++(&local_398);
  }
  std::
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::~map((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          *)&callbackIter.m_slotNdx);
  std::
  vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
  ::~vector((vector<vk::(anonymous_namespace)::AllocationSlot,_std::allocator<vk::(anonymous_namespace)::AllocationSlot>_>
             *)&ptrToSlotIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void validateAllocationCallbacks (const AllocationCallbackRecorder& recorder, AllocationCallbackValidationResults* results)
{
	std::vector<AllocationSlot>		allocations;
	std::map<void*, size_t>			ptrToSlotIndex;

	DE_ASSERT(results->liveAllocations.empty() && results->violations.empty());

	for (AllocationCallbackRecorder::RecordIterator callbackIter = recorder.getRecordsBegin();
		 callbackIter != recorder.getRecordsEnd();
		 ++callbackIter)
	{
		const AllocationCallbackRecord&		record	= *callbackIter;

		// Validate scope
		{
			const VkSystemAllocationScope* const	scopePtr	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION			? &record.data.allocation.scope
																: record.type == AllocationCallbackRecord::TYPE_REALLOCATION		? &record.data.reallocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION	? &record.data.internalAllocation.scope
																: record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE		? &record.data.internalAllocation.scope
																: DE_NULL;

			if (scopePtr && !de::inBounds(*scopePtr, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE));
		}

		// Validate alignment
		if (record.type == AllocationCallbackRecord::TYPE_ALLOCATION ||
			record.type == AllocationCallbackRecord::TYPE_REALLOCATION)
		{
			if (!deIsPowerOfTwoSize(getAlignment(record)))
				results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_ALIGNMENT));
		}

		// Validate actual allocation behavior
		switch (record.type)
		{
			case AllocationCallbackRecord::TYPE_ALLOCATION:
			{
				if (record.data.allocation.returnedPtr)
				{
					if (!de::contains(ptrToSlotIndex, record.data.allocation.returnedPtr))
					{
						ptrToSlotIndex[record.data.allocation.returnedPtr] = allocations.size();
						allocations.push_back(AllocationSlot(record, true));
					}
					else
					{
						const size_t		slotNdx		= ptrToSlotIndex[record.data.allocation.returnedPtr];
						if (!allocations[slotNdx].isLive)
						{
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
						else
						{
							// we should not have multiple live allocations with the same pointer
							DE_ASSERT(false);
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_REALLOCATION:
			{
				if (de::contains(ptrToSlotIndex, record.data.reallocation.original))
				{
					const size_t		origSlotNdx		= ptrToSlotIndex[record.data.reallocation.original];
					AllocationSlot&		origSlot		= allocations[origSlotNdx];

					DE_ASSERT(record.data.reallocation.original != DE_NULL);

					if (record.data.reallocation.size > 0)
					{
						if (getAlignment(origSlot.record) != record.data.reallocation.alignment)
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT));

						if (record.data.reallocation.original == record.data.reallocation.returnedPtr)
						{
							if (!origSlot.isLive)
							{
								results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_FREED_PTR));
								origSlot.isLive	= true; // Mark live to suppress further errors
							}

							// Just update slot record
							allocations[origSlotNdx].record = record;
						}
						else
						{
							if (record.data.reallocation.returnedPtr)
							{
								allocations[origSlotNdx].isLive = false;
								if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
								{
									ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
									allocations.push_back(AllocationSlot(record, true));
								}
								else
								{
									const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
									if (!allocations[slotNdx].isLive)
									{
										allocations[slotNdx].isLive = true;
										allocations[slotNdx].record = record;
									}
									else
									{
										// we should not have multiple live allocations with the same pointer
										DE_ASSERT(false);
									}
								}
							}
							// else original ptr remains valid and live
						}
					}
					else
					{
						DE_ASSERT(!record.data.reallocation.returnedPtr);

						origSlot.isLive = false;
					}
				}
				else
				{
					if (record.data.reallocation.original)
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR));

					if (record.data.reallocation.returnedPtr)
					{
						if (!de::contains(ptrToSlotIndex, record.data.reallocation.returnedPtr))
						{
							ptrToSlotIndex[record.data.reallocation.returnedPtr] = allocations.size();
							allocations.push_back(AllocationSlot(record, true));
						}
						else
						{
							const size_t slotNdx = ptrToSlotIndex[record.data.reallocation.returnedPtr];
							DE_ASSERT(!allocations[slotNdx].isLive);
							allocations[slotNdx].isLive = true;
							allocations[slotNdx].record = record;
						}
					}
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_FREE:
			{
				if (record.data.free.mem != DE_NULL) // Freeing null pointer is valid and ignored
				{
					if (de::contains(ptrToSlotIndex, record.data.free.mem))
					{
						const size_t	slotNdx		= ptrToSlotIndex[record.data.free.mem];

						if (allocations[slotNdx].isLive)
							allocations[slotNdx].isLive = false;
						else
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_DOUBLE_FREE));
					}
					else
						results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR));
				}

				break;
			}

			case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
			case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			{
				if (de::inBounds(record.data.internalAllocation.type, (VkInternalAllocationType)0, VK_INTERNAL_ALLOCATION_TYPE_LAST))
				{
					size_t* const		totalAllocSizePtr	= &results->internalAllocationTotal[record.data.internalAllocation.type][record.data.internalAllocation.scope];
					const size_t		size				= record.data.internalAllocation.size;

					if (record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE)
					{
						if (*totalAllocSizePtr < size)
						{
							results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL));
							*totalAllocSizePtr = 0; // Reset to 0 to suppress compound errors
						}
						else
							*totalAllocSizePtr -= size;
					}
					else
						*totalAllocSizePtr += size;
				}
				else
					results->violations.push_back(AllocationCallbackViolation(record, AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE));

				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	DE_ASSERT(!de::contains(ptrToSlotIndex, DE_NULL));

	// Collect live allocations
	for (std::vector<AllocationSlot>::const_iterator slotIter = allocations.begin();
		 slotIter != allocations.end();
		 ++slotIter)
	{
		if (slotIter->isLive)
			results->liveAllocations.push_back(slotIter->record);
	}
}